

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O2

void __thiscall
optimization::graph_color::Graph_Color::Graph_Color(Graph_Color *this,u_int color_num,bool enable)

{
  _Rb_tree_header *p_Var1;
  allocator<char> local_11;
  
  (this->super_MirOptimizePass)._vptr_MirOptimizePass =
       (_func_int **)&PTR_pass_name_abi_cxx11__001d9988;
  this->color_num = color_num;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->name,"graph_color",&local_11);
  this->enable = enable;
  p_Var1 = &(this->blk_livevar_analyse)._M_t._M_impl.super__Rb_tree_header;
  (this->blk_livevar_analyse)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->blk_livevar_analyse)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->blk_livevar_analyse)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->blk_livevar_analyse)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->blk_livevar_analyse)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->func_color_map)._M_h._M_buckets = &(this->func_color_map)._M_h._M_single_bucket;
  (this->func_color_map)._M_h._M_bucket_count = 1;
  (this->func_color_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->func_color_map)._M_h._M_element_count = 0;
  (this->func_color_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->func_color_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->func_color_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->func_unused_colors)._M_h._M_buckets = &(this->func_unused_colors)._M_h._M_single_bucket;
  (this->func_unused_colors)._M_h._M_bucket_count = 1;
  (this->func_unused_colors)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->func_unused_colors)._M_h._M_element_count = 0;
  (this->func_unused_colors)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->func_unused_colors)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->func_unused_colors)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->func_conflict_map)._M_t._M_impl.super__Rb_tree_header;
  (this->func_conflict_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->func_conflict_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->func_conflict_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->func_conflict_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->func_conflict_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->var_blks)._M_t._M_impl.super__Rb_tree_header;
  (this->var_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->var_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->var_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->var_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->var_blks)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

Graph_Color(u_int color_num, bool enable = true)
      : color_num(color_num), enable(enable) {}